

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

Token * __thiscall
EOPlus::Parser_Token_Server_Base::RejectToken
          (Token *__return_storage_ptr__,Parser_Token_Server_Base *this)

{
  Parser_Token_Server_Base *this_local;
  
  Token::Token(__return_storage_ptr__,&this->reject_token);
  return __return_storage_ptr__;
}

Assistant:

Token RejectToken() const { return this->reject_token; }